

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_reject(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  file_index_t fVar6;
  undefined4 extraout_var;
  char *pcVar7;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  _Var8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  element_type *this_01;
  ulong uVar12;
  ulong uVar13;
  span<const_char> sVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  hash_request hr;
  sha256_hash file_root;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar5 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar5) + 0x1f) & 1) == 0) {
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_message);
  }
  else {
    this_00 = &this->m_recv_buffer;
    iVar5 = crypto_receive_buffer::packet_size(this_00);
    if (iVar5 == 0x31) {
      bVar4 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar4) {
        return;
      }
      p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_01 = (torrent *)0x0;
        local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_01 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        }
        iVar5 = p_Var3->_M_use_count;
        do {
          if (iVar5 == 0) {
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = (element_type *)0x0;
            goto LAB_0018bae4;
          }
          LOCK();
          iVar2 = p_Var3->_M_use_count;
          bVar4 = iVar5 == iVar2;
          if (bVar4) {
            p_Var3->_M_use_count = iVar5 + 1;
            iVar2 = iVar5;
          }
          iVar5 = iVar2;
          UNLOCK();
        } while (!bVar4);
        local_80 = p_Var3;
        if (p_Var3->_M_use_count == 0) {
          this_01 = (element_type *)0x0;
        }
LAB_0018bae4:
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &p_Var3->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = p_Var3->_M_weak_count;
          p_Var3->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*p_Var3->_vptr__Sp_counted_base[3])();
        }
      }
      sVar14 = crypto_receive_buffer::get(this_00);
      pcVar7 = sVar14.m_ptr;
      file_root.m_number._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar7 + 1);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar7 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar7 + 0x19);
      fVar6 = file_storage::file_index_for_root
                        (&((this_01->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_files,&file_root);
      lVar9 = 0;
      uVar11 = 0;
      do {
        uVar11 = (uint)(byte)pcVar7[lVar9 + 0x21] | uVar11 << 8;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      lVar9 = 0;
      uVar12 = 0;
      do {
        hr.index = (uint)(byte)pcVar7[lVar9 + 0x25] | (int)uVar12 << 8;
        uVar12 = (ulong)(uint)hr.index;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      lVar9 = 0;
      uVar13 = 0;
      do {
        hr.count = (uint)(byte)pcVar7[lVar9 + 0x29] | (int)uVar13 << 8;
        uVar13 = (ulong)(uint)hr.count;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      lVar9 = 0;
      uVar10 = 0;
      do {
        hr.proof_layers = (uint)(byte)pcVar7[lVar9 + 0x2d] | (int)uVar10 << 8;
        uVar10 = (ulong)(uint)hr.proof_layers;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 != 4);
      hr.file = fVar6;
      hr.base = uVar11;
      bVar4 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
      if (bVar4) {
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,"HASH_REJECT",
                   "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)fVar6.m_val,
                   (ulong)uVar11,uVar12,uVar13,uVar10);
      }
      _Var8 = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_request_const>>
                        ((this->m_hash_requests).
                         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_hash_requests).
                         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&hr);
      if (_Var8._M_current !=
          (this->m_hash_requests).
          super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (this->m_hash_requests).
        super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
        ._M_impl.super__Vector_impl_data._M_finish = _Var8._M_current;
        torrent::hashes_rejected(this_01,&hr);
        maybe_send_hash_request(this);
      }
      if (local_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      return;
    }
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_hash_reject);
  }
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&file_root,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_hash_reject(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_reject, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = t->torrent_file().files().file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REJECT"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		if (new_end == m_hash_requests.end()) return;
		m_hash_requests.erase(new_end, m_hash_requests.end());

		t->hashes_rejected(hr);

		maybe_send_hash_request();
	}